

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

Bool AfterSpace(Lexer *lexer,Node *node)

{
  Node *node_00;
  Bool BVar1;
  Bool BVar2;
  Node *pNVar3;
  bool bVar4;
  
  BVar1 = prvTidynodeCMIsEmpty(node);
  BVar2 = prvTidynodeCMIsInline(node);
  if (BVar2 == no) {
    return yes;
  }
  bVar4 = BVar1 == no;
  pNVar3 = node;
  do {
    while( true ) {
      node_00 = node->prev;
      if (node_00 != (Node *)0x0) {
        BVar1 = prvTidynodeIsText(node_00);
        if (BVar1 != no) {
          BVar1 = prvTidyTextNodeEndWithSpace(lexer,node_00);
          return BVar1;
        }
        if ((node_00->tag != (Dict *)0x0) && (node_00->tag->id == TidyTag_BR)) {
          return yes;
        }
        return no;
      }
      if (!bVar4) break;
      node = pNVar3->parent;
      BVar1 = prvTidynodeCMIsInline(node);
      bVar4 = true;
      pNVar3 = node;
      if (BVar1 == no) {
        return yes;
      }
    }
    BVar1 = prvTidynodeCMIsInline(node->parent);
    if (BVar1 == no) {
      return no;
    }
    node = node->parent;
    BVar1 = prvTidynodeCMIsInline(node);
  } while (BVar1 != no);
  return yes;
}

Assistant:

static Bool AfterSpace(Lexer *lexer, Node *node)
{
    return AfterSpaceImp(lexer, node, TY_(nodeCMIsEmpty)(node));
}